

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearDriveline::Initialize
          (ChLinkMotorLinearDriveline *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChFrame<double> *mframe1,
          ChFrame<double> *mframe2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChShaftsBodyTranslation *pCVar2;
  long lVar3;
  ChShaftsBody *this_00;
  shared_ptr<chrono::ChBodyFrame> local_1a8;
  shared_ptr<chrono::ChShaft> local_198;
  shared_ptr<chrono::ChBodyFrame> local_188;
  shared_ptr<chrono::ChShaft> local_178;
  shared_ptr<chrono::ChBodyFrame> local_168;
  shared_ptr<chrono::ChShaft> local_158;
  shared_ptr<chrono::ChBodyFrame> local_148;
  shared_ptr<chrono::ChBodyFrame> local_138;
  ChFrame<double> local_128;
  ChFrame<double> local_a0;
  
  local_138.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_138.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_148.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_a0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_a0.coord.pos.m_data[0] = (mframe1->coord).pos.m_data[0];
  local_a0.coord.pos.m_data[1] = (mframe1->coord).pos.m_data[1];
  local_a0.coord.pos.m_data[2] = (mframe1->coord).pos.m_data[2];
  local_a0.coord.rot.m_data[0] = (mframe1->coord).rot.m_data[0];
  local_a0.coord.rot.m_data[1] = (mframe1->coord).rot.m_data[1];
  local_a0.coord.rot.m_data[2] = (mframe1->coord).rot.m_data[2];
  local_a0.coord.rot.m_data[3] = (mframe1->coord).rot.m_data[3];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (mframe1->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_128._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_128.coord.pos.m_data[0] = (mframe2->coord).pos.m_data[0];
  local_128.coord.pos.m_data[1] = (mframe2->coord).pos.m_data[1];
  local_128.coord.pos.m_data[2] = (mframe2->coord).pos.m_data[2];
  local_128.coord.rot.m_data[0] = (mframe2->coord).rot.m_data[0];
  local_128.coord.rot.m_data[1] = (mframe2->coord).rot.m_data[1];
  local_128.coord.rot.m_data[2] = (mframe2->coord).rot.m_data[2];
  local_128.coord.rot.m_data[3] = (mframe2->coord).rot.m_data[3];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (mframe2->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  ChLinkMateGeneric::Initialize
            ((ChLinkMateGeneric *)this,&local_138,&local_148,pos_are_relative,&local_a0,&local_128);
  if (local_148.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_158.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)&(this->super_ChLinkMotorLinear).field_0x278;
  local_158.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x280;
  pCVar2 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar3 = *(long *)&this->field_0x280;
  if (lVar3 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
    }
  }
  local_168.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_168.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChShaftsBodyTranslation::Initialize
            (pCVar2,&local_158,&local_168,(ChVector<double> *)&VECT_X,(ChVector<double> *)&VNULL);
  if (local_168.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_178.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_178.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  pCVar2 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_188.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_188.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChShaftsBodyTranslation::Initialize
            (pCVar2,&local_178,&local_188,(ChVector<double> *)&VECT_X,(ChVector<double> *)&VNULL);
  if (local_188.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_178.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_198.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_198.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  this_00 = (this->innerconstraint2rot).
            super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_1a8.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a8.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChShaftsBody::Initialize(this_00,&local_198,&local_1a8,(ChVector<double> *)&VECT_X);
  if (local_1a8.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_198.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                            std::shared_ptr<ChBodyFrame> mbody2,
                                            bool pos_are_relative,
                                            ChFrame<> mframe1,
                                            ChFrame<> mframe2) {
    ChLinkMotorLinear::Initialize(mbody1, mbody2, pos_are_relative, mframe1, mframe2);
    innerconstraint1lin->Initialize(innershaft1lin, mbody1, VECT_X, VNULL);
    innerconstraint2lin->Initialize(innershaft2lin, mbody2, VECT_X, VNULL);
    innerconstraint2rot->Initialize(innershaft2rot, mbody2, VECT_X);
}